

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O0

void __thiscall Automaton::visitReadNode(Automaton *this,ReadNode node)

{
  ReadNode node_00;
  bool bVar1;
  pointer pNVar2;
  reference p_Var3;
  int *piVar4;
  _Rb_tree_const_iterator<std::_List_iterator<QString>_> __first;
  pointer pSVar5;
  _Rb_tree_const_iterator<Node<Read>_> *p_Var6;
  int iVar7;
  _List_iterator<QString> *in_RDI;
  long in_FS_OFFSET;
  NameSet *src;
  NameSet *dst;
  iterator tos;
  iterator r;
  edge_iterator edge;
  int N;
  Node<Read> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar8;
  _Rb_tree_const_iterator<std::_List_iterator<QString>_> __last;
  QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
  *in_stack_ffffffffffffff90;
  Automaton *in_stack_ffffffffffffffb0;
  _Self local_40;
  _Base_ptr local_38;
  _Base_ptr local_30;
  _Self local_28;
  _Self local_20;
  undefined4 in_stack_ffffffffffffffe8;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = std::_Rb_tree_const_iterator<Node<Read>_>::operator->
                     ((_Rb_tree_const_iterator<Node<Read>_> *)0x120d00);
  if (pNVar2->dfn == 0) {
    iVar7 = *(int *)&in_RDI[0x10]._M_node + 1;
    *(int *)&in_RDI[0x10]._M_node = iVar7;
    pNVar2 = std::_Rb_tree_const_iterator<Node<Read>_>::operator->
                       ((_Rb_tree_const_iterator<Node<Read>_> *)0x120d30);
    pNVar2->dfn = iVar7;
    QStack<std::_Rb_tree_const_iterator<Node<Read>_>_>::push
              ((QStack<std::_Rb_tree_const_iterator<Node<Read>_>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (_Rb_tree_const_iterator<Node<Read>_> *)in_stack_ffffffffffffff58);
    local_20._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
    std::_Rb_tree_const_iterator<Node<Read>_>::operator->
              ((_Rb_tree_const_iterator<Node<Read>_> *)0x120d73);
    local_20._M_node = (_List_node_base *)Node<Read>::begin(in_stack_ffffffffffffff58);
    while( true ) {
      std::_Rb_tree_const_iterator<Node<Read>_>::operator->
                ((_Rb_tree_const_iterator<Node<Read>_> *)0x120d90);
      local_28._M_node = (_List_node_base *)Node<Read>::end(in_stack_ffffffffffffff58);
      bVar1 = std::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      local_30 = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
      p_Var3 = std::_List_iterator<std::_Rb_tree_const_iterator<Node<Read>_>_>::operator*
                         ((_List_iterator<std::_Rb_tree_const_iterator<Node<Read>_>_> *)0x120dd7);
      local_38 = p_Var3->_M_node;
      node_00._M_node._4_4_ = iVar7;
      node_00._M_node._0_4_ = in_stack_ffffffffffffffe8;
      local_30 = local_38;
      visitReadNode(in_stack_ffffffffffffffb0,node_00);
      pNVar2 = std::_Rb_tree_const_iterator<Node<Read>_>::operator->
                         ((_Rb_tree_const_iterator<Node<Read>_> *)0x120e02);
      piVar4 = qMin<int>((int *)&stack0xffffffffffffffec,&pNVar2->dfn);
      iVar8 = *piVar4;
      pNVar2 = std::_Rb_tree_const_iterator<Node<Read>_>::operator->
                         ((_Rb_tree_const_iterator<Node<Read>_> *)0x120e29);
      pNVar2->dfn = iVar8;
      std::_Rb_tree_const_iterator<Node<Read>_>::operator->
                ((_Rb_tree_const_iterator<Node<Read>_> *)0x120e4c);
      std::_List_iterator<State>::operator->((_List_iterator<State> *)0x120e58);
      std::_Rb_tree_const_iterator<Node<Read>_>::operator->
                ((_Rb_tree_const_iterator<Node<Read>_> *)0x120e6e);
      __first._M_node =
           (_Base_ptr)
           QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
           ::operator[](in_stack_ffffffffffffff90,in_RDI);
      std::_Rb_tree_const_iterator<Node<Read>_>::operator->
                ((_Rb_tree_const_iterator<Node<Read>_> *)0x120ea1);
      pSVar5 = std::_List_iterator<State>::operator->((_List_iterator<State> *)0x120ead);
      __last._M_node = (_Base_ptr)&pSVar5->reads;
      std::_Rb_tree_const_iterator<Node<Read>_>::operator->
                ((_Rb_tree_const_iterator<Node<Read>_> *)0x120ec0);
      QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
      ::operator[](in_stack_ffffffffffffff90,in_RDI);
      in_stack_ffffffffffffffb0 = (Automaton *)__first._M_node;
      std::
      set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
      ::begin((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
               *)in_stack_ffffffffffffff58);
      std::
      set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
      ::end((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
             *)in_stack_ffffffffffffff58);
      std::
      set<std::_List_iterator<QString>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
      ::insert<std::_Rb_tree_const_iterator<std::_List_iterator<QString>>>
                ((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                  *)in_stack_ffffffffffffff58,__first,__last);
      std::_List_iterator<std::_Rb_tree_const_iterator<Node<Read>_>_>::operator++(&local_20);
    }
    pNVar2 = std::_Rb_tree_const_iterator<Node<Read>_>::operator->
                       ((_Rb_tree_const_iterator<Node<Read>_> *)0x120f35);
    if (pNVar2->dfn == iVar7) {
      local_40._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
      p_Var6 = QStack<std::_Rb_tree_const_iterator<Node<Read>_>_>::top
                         ((QStack<std::_Rb_tree_const_iterator<Node<Read>_>_> *)0x120f5b);
      local_40._M_node = p_Var6->_M_node;
      do {
        p_Var6 = QStack<std::_Rb_tree_const_iterator<Node<Read>_>_>::top
                           ((QStack<std::_Rb_tree_const_iterator<Node<Read>_>_> *)0x120f71);
        local_40._M_node = p_Var6->_M_node;
        QStack<std::_Rb_tree_const_iterator<Node<Read>_>_>::pop
                  ((QStack<std::_Rb_tree_const_iterator<Node<Read>_>_> *)in_stack_ffffffffffffff58);
        pNVar2 = std::_Rb_tree_const_iterator<Node<Read>_>::operator->
                           ((_Rb_tree_const_iterator<Node<Read>_> *)0x120f96);
        pNVar2->dfn = 0x7fffffff;
        bVar1 = std::operator!=(&local_40,&local_10);
      } while (bVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Automaton::visitReadNode (ReadNode node)
{
  if (node->dfn != 0)
    return; // nothing to do

  int N = node->dfn = ++_M_reads_dfn;
  _M_reads_stack.push (node);

#ifndef QLALR_NO_DEBUG_INCLUDES
  // qerr() << "*** Debug. visit node (" << id (node->data.state) << ", " << node->data.nt << ")  N = " << N << Qt::endl;
#endif

  for (ReadsGraph::edge_iterator edge = node->begin (); edge != node->end (); ++edge)
    {
      ReadsGraph::iterator r = *edge;

      visitReadNode (r);

      node->dfn = qMin (N, r->dfn);

      NameSet &dst = node->data.state->reads [node->data.nt];
      NameSet &src = r->data.state->reads [r->data.nt];
      dst.insert (src.begin (), src.end ());
    }

  if (node->dfn == N)
    {
      ReadsGraph::iterator tos = _M_reads_stack.top ();

      do {
        tos = _M_reads_stack.top ();
        _M_reads_stack.pop ();
        tos->dfn = INT_MAX;
      } while (tos != node);
    }
}